

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbbackingstore.cpp
# Opt level: O0

FlushResult __thiscall
QXcbBackingStore::rhiFlush
          (QXcbBackingStore *this,QWindow *window,qreal sourceDevicePixelRatio,QRegion *region,
          QPoint *offset,QPlatformTextureList *textures,bool translucentBackground)

{
  bool bVar1;
  long lVar2;
  xcb_connection_t *pxVar3;
  QPlatformTextureList *in_RCX;
  QPoint *in_RDX;
  QRegion *in_RSI;
  QWindow *in_RDI;
  bool in_R8B;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  QXcbBackingStoreImage *unaff_retaddr;
  QXcbWindow *platformWindow;
  FlushResult result;
  QXcbBackingStoreImage *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  QXcbWindow *local_78;
  QSize *in_stack_ffffffffffffff90;
  bool local_59;
  FlushResult local_14;
  long lVar4;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  local_59 = true;
  if (*(long *)(in_RDI + 0x18) != 0) {
    QXcbBackingStoreImage::size(in_stack_ffffffffffffff78);
    local_59 = QSize::isEmpty(in_stack_ffffffffffffff90);
  }
  if (local_59 == false) {
    QXcbBackingStoreImage::flushScrolledRegion(unaff_retaddr,SUB81((ulong)lVar4 >> 0x38,0));
    local_14 = QPlatformBackingStore::rhiFlush(in_RDI,in_XMM0_Qa,in_RSI,in_RDX,in_RCX,in_R8B);
    if (local_14 == FlushSuccess) {
      lVar2 = QWindow::handle();
      if (lVar2 == 0) {
        local_78 = (QXcbWindow *)0x0;
      }
      else {
        local_78 = (QXcbWindow *)(lVar2 + -0x20);
      }
      bVar1 = QXcbWindow::needsSync(local_78);
      if (bVar1) {
        QXcbWindow::updateSyncRequestCounter
                  ((QXcbWindow *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      }
      else {
        pxVar3 = QXcbObject::xcb_connection((QXcbObject *)0x14106b);
        xcb_flush(pxVar3);
      }
      local_14 = FlushSuccess;
    }
  }
  else {
    local_14 = FlushFailed;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

QPlatformBackingStore::FlushResult QXcbBackingStore::rhiFlush(QWindow *window,
                                                              qreal sourceDevicePixelRatio,
                                                              const QRegion &region,
                                                              const QPoint &offset,
                                                              QPlatformTextureList *textures,
                                                              bool translucentBackground)
{
    if (!m_image || m_image->size().isEmpty())
        return FlushFailed;

    m_image->flushScrolledRegion(true);

    auto result = QPlatformBackingStore::rhiFlush(window, sourceDevicePixelRatio, region, offset,
                                                  textures, translucentBackground);
    if (result != FlushSuccess)
        return result;
    QXcbWindow *platformWindow = static_cast<QXcbWindow *>(window->handle());
    if (platformWindow->needsSync()) {
        platformWindow->updateSyncRequestCounter();
    } else {
        xcb_flush(xcb_connection());
    }

    return FlushSuccess;
}